

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::down_heap
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint pos)

{
  float fVar1;
  uint uVar2;
  vq_node *pvVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  puVar6 = (this->m_heap).m_p;
  uVar2 = puVar6[pos];
  uVar8 = pos * 2;
  uVar7 = this->m_heap_size;
  uVar5 = (ulong)pos;
  if (uVar8 <= uVar7) {
    fVar1 = (this->m_nodes).m_p[uVar2].m_variance;
    do {
      pvVar3 = (this->m_nodes).m_p;
      puVar6 = (this->m_heap).m_p;
      uVar4 = (ulong)uVar8;
      uVar9 = uVar8;
      if (uVar8 < uVar7) {
        uVar8 = uVar8 | 1;
        if (pvVar3[puVar6[uVar4]].m_variance <= pvVar3[puVar6[uVar8]].m_variance &&
            pvVar3[puVar6[uVar8]].m_variance != pvVar3[puVar6[uVar4]].m_variance) {
          uVar4 = (ulong)uVar8;
          uVar9 = uVar8;
        }
      }
      uVar5 = (ulong)pos;
      if (pvVar3[puVar6[uVar4]].m_variance <= fVar1 && fVar1 != pvVar3[puVar6[uVar4]].m_variance)
      goto LAB_00145e9a;
      puVar6[uVar5] = puVar6[uVar4];
      uVar8 = uVar9 * 2;
      uVar7 = this->m_heap_size;
      pos = uVar9;
    } while (uVar8 <= uVar7);
    puVar6 = (this->m_heap).m_p;
    uVar5 = uVar4;
  }
LAB_00145e9a:
  puVar6[uVar5] = uVar2;
  return;
}

Assistant:

void down_heap(uint pos) {
    uint child;
    uint orig = m_heap[pos];

    const float orig_variance = m_nodes[orig].m_variance;

    while ((child = (pos << 1)) <= m_heap_size) {
      if (child < m_heap_size) {
        if (m_nodes[m_heap[child]].m_variance < m_nodes[m_heap[child + 1]].m_variance)
          child++;
      }

      if (orig_variance > m_nodes[m_heap[child]].m_variance)
        break;

      m_heap[pos] = m_heap[child];

      pos = child;
    }

    m_heap[pos] = orig;
  }